

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O3

RefCntAutoPtr<Diligent::ISampler> __thiscall
Diligent::RefCntWeakPtr<Diligent::ISampler>::Lock(RefCntWeakPtr<Diligent::ISampler> *this)

{
  RefCntWeakPtr<Diligent::ISampler> *in_RSI;
  RefCntAutoPtr<Diligent::IObject> spOwner;
  RefCntAutoPtr<Diligent::IObject> local_28;
  DoublePtrHelper<Diligent::IObject> local_20;
  
  local_20.m_pAutoPtr = &local_28;
  this->m_pRefCounters = (RefCountersImpl *)0x0;
  if (in_RSI->m_pRefCounters != (RefCountersImpl *)0x0) {
    local_28.m_pObject = (IObject *)0x0;
    local_20.NewRawPtr = (IObject *)0x0;
    RefCountersImpl::QueryObject(in_RSI->m_pRefCounters,&local_20.NewRawPtr);
    RefCntAutoPtr<Diligent::IObject>::DoublePtrHelper<Diligent::IObject>::~DoublePtrHelper
              (&local_20);
    if (local_28.m_pObject == (IObject *)0x0) {
      Release(in_RSI);
    }
    else {
      RefCntAutoPtr<Diligent::ISampler>::operator=
                ((RefCntAutoPtr<Diligent::ISampler> *)this,in_RSI->m_pObject);
    }
    if (local_28.m_pObject != (IObject *)0x0) {
      (*(local_28.m_pObject)->_vptr_IObject[2])();
    }
  }
  return (RefCntAutoPtr<Diligent::ISampler>)(ISampler *)this;
}

Assistant:

RefCntAutoPtr<T> Lock()
    {
        RefCntAutoPtr<T> spObj;
        if (m_pRefCounters)
        {
            // Try to obtain a pointer to the owner object.
            // spOwner is only used to keep the object
            // alive while obtaining strong reference from
            // the raw pointer m_pObject
            RefCntAutoPtr<IObject> spOwner;
            m_pRefCounters->QueryObject(&spOwner);
            if (spOwner)
            {
                // If owner is alive, we can use our RAW pointer to
                // create strong reference
                spObj = m_pObject;
            }
            else
            {
                // Owner object has been destroyed. There is no reason
                // to keep this weak reference anymore
                Release();
            }
        }
        return spObj;
    }